

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *fields,
               size_t parent_scope_size,FlatAllocator *alloc)

{
  TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pTVar1;
  Base<google::protobuf::FieldOptions> *pBVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  Rep *pRVar10;
  void **ppvVar11;
  undefined8 *puVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  void **ppvVar17;
  int iVar18;
  protobuf local_40 [16];
  
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) {
LAB_00ef6d2e:
    PlanAllocationSize(local_40);
LAB_00ef6d38:
    internal::protobuf_assumption_failed
              ("!value || _impl_.options_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x3b89);
  }
  pTVar1 = &(alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_;
  (pTVar1->payload_).super_Base<char>.value =
       (pTVar1->payload_).super_Base<char>.value +
       (fields->super_RepeatedPtrFieldBase).current_size_ * 0x58;
  ppvVar11 = (void **)fields;
  ppvVar17 = (void **)fields;
  if (((ulong)(fields->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar10 = internal::RepeatedPtrFieldBase::rep(&fields->super_RepeatedPtrFieldBase);
    ppvVar17 = pRVar10->elements;
    if (((ulong)(fields->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar10 = internal::RepeatedPtrFieldBase::rep(&fields->super_RepeatedPtrFieldBase);
      ppvVar11 = pRVar10->elements;
    }
  }
  iVar3 = (fields->super_RepeatedPtrFieldBase).current_size_;
  if (ppvVar17 != ppvVar11 + iVar3) {
    iVar18 = 0x11;
    if (parent_scope_size != 0) {
      iVar18 = (int)parent_scope_size + 0x12;
    }
    do {
      pvVar5 = *ppvVar17;
      uVar4 = *(uint *)((long)pvVar5 + 0x10);
      if (((uVar4 & 0x20) != 0) && (*(long *)((long)pvVar5 + 0x40) == 0)) goto LAB_00ef6d38;
      if ((uVar4 & 0x20) != 0) {
        if ((alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
          pBVar2 = &(alloc->
                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ).total_.payload_.super_Base<google::protobuf::FieldOptions>;
          pBVar2->value = pBVar2->value + 1;
          uVar4 = *(uint *)((long)pvVar5 + 0x10);
          goto LAB_00ef6bbb;
        }
LAB_00ef6d24:
        PlanAllocationSize(local_40);
        goto LAB_00ef6d2e;
      }
LAB_00ef6bbb:
      puVar12 = (undefined8 *)(*(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffffc);
      pcVar6 = (char *)*puVar12;
      lVar7 = puVar12[1];
      iVar9 = (int)lVar7;
      if ((uVar4 & 0x10) == 0) {
        if ((alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) {
LAB_00ef6d1a:
          PlanAllocationSize(local_40);
          goto LAB_00ef6d24;
        }
LAB_00ef6c0e:
        iVar15 = iVar18 + iVar9;
        if (lVar7 != 0) {
          if (0x19 < (byte)(*pcVar6 + 0x9fU)) {
LAB_00ef6c6c:
            iVar15 = iVar9 + iVar15;
            bVar8 = true;
            uVar16 = 0;
LAB_00ef6c78:
            lVar14 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + (uint)(pcVar6[lVar14] == '_');
              lVar14 = lVar14 + 1;
            } while (lVar7 != lVar14);
            iVar15 = ((iVar15 + iVar9) - iVar13) + 2;
            if (!bVar8) goto LAB_00ef6cc5;
            lVar14 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + (uint)(pcVar6[lVar14] == '_');
              lVar14 = lVar14 + 1;
            } while (lVar7 != lVar14);
            iVar9 = iVar9 - iVar13;
            goto LAB_00ef6cc9;
          }
          lVar14 = 0;
          bVar8 = false;
          do {
            if ((byte)(pcVar6[lVar14] + 0xbfU) < 0x1a) goto LAB_00ef6c6c;
            if (pcVar6[lVar14] == '_') {
              bVar8 = true;
            }
            lVar14 = lVar14 + 1;
          } while (lVar7 != lVar14);
          if (bVar8) {
            lVar14 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + (uint)(pcVar6[lVar14] == '_');
              lVar14 = lVar14 + 1;
            } while (lVar7 != lVar14);
            iVar15 = ((iVar15 + iVar9) - iVar13) + 1;
          }
        }
      }
      else {
        if ((alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) goto LAB_00ef6d1a;
        uVar16 = *(ulong *)((long)pvVar5 + 0x38) & 0xfffffffffffffffc;
        iVar15 = iVar18 + iVar9 * 2;
        if (uVar16 == 0) goto LAB_00ef6c0e;
        if (lVar7 != 0) {
          bVar8 = false;
          goto LAB_00ef6c78;
        }
        iVar15 = iVar15 + 2;
LAB_00ef6cc5:
        iVar9 = (int)*(undefined8 *)(uVar16 + 8);
LAB_00ef6cc9:
        iVar15 = iVar15 + iVar9 + 1;
      }
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<char>(&alloc->
                         super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ,iVar15);
      if (((~*(uint *)((long)pvVar5 + 0x10) & 0x408) == 0) &&
         ((*(int *)((long)pvVar5 + 0x58) == 0xc || (*(int *)((long)pvVar5 + 0x58) == 9)))) {
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)alloc,1);
      }
      ppvVar17 = ppvVar17 + 1;
    } while (ppvVar17 != ppvVar11 + iVar3);
  }
  return;
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }